

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cc
# Opt level: O3

int TVMFuncGetGlobal(char *name,TVMFunctionHandle *out)

{
  function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)> *__x;
  function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)> *this;
  allocator<char> local_41;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,name,&local_41);
  __x = &tvm::runtime::Registry::Get(&local_40)->body_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (__x == (function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)> *)0x0) {
    this = (function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)> *)0x0;
  }
  else {
    this = (function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)> *)operator_new(0x20)
    ;
    std::function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)>::function(this,__x);
  }
  *out = this;
  return 0;
}

Assistant:

int TVMFuncGetGlobal(const char *name, TVMFunctionHandle *out) {
  API_BEGIN();
  const tvm::runtime::PackedFunc *fp =
      tvm::runtime::Registry::Get(name);
  if (fp != nullptr) {
    *out = new tvm::runtime::PackedFunc(*fp); // NOLINT(*)
  } else {
    *out = nullptr;
  }
  API_END();
}